

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

Result<unsigned_int> * __thiscall
wasm::IRBuilder::addScratchLocal
          (Result<unsigned_int> *__return_storage_ptr__,IRBuilder *this,Type type)

{
  undefined8 *puVar1;
  Function *func;
  Index IVar2;
  bool in_CL;
  Type in_R8;
  string_view root;
  Name NVar3;
  Name name;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  func = this->func;
  if (func == (Function *)0x0) {
    local_48 = &local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"scratch local required, but there is no function context","");
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err> = puVar1;
    if (local_48 == &local_38) {
      *puVar1 = local_38;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x18) = uStack_30;
    }
    else {
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err> = local_48;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10) = local_38;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 8) = local_40;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\x01';
  }
  else {
    root = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe33ac5),in_CL);
    NVar3 = Names::getValidLocalName(func,(Name)root);
    name.super_IString.str._M_len = NVar3.super_IString.str._M_str;
    name.super_IString.str._M_str = (char *)type.id;
    IVar2 = Builder::addVar((Builder *)this->func,NVar3.super_IString.str._M_len,name,in_R8);
    *(Index *)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> = IVar2;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Index> IRBuilder::addScratchLocal(Type type) {
  if (!func) {
    return Err{"scratch local required, but there is no function context"};
  }
  Name name = Names::getValidLocalName(*func, "scratch");
  return Builder::addVar(func, name, type);
}